

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O2

void __thiscall
NTrodeObj::serialize<cereal::PortableBinaryOutputArchive>
          (NTrodeObj *this,PortableBinaryOutputArchive *archive)

{
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::operator()
            ((OutputArchive<cereal::PortableBinaryOutputArchive,1u> *)archive,&this->id,&this->index
             ,&this->hw_chans);
  return;
}

Assistant:

void serialize(Archive &archive){
        archive(id, index, hw_chans);
    }